

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O2

bool __thiscall mnf::Manifold::isInTxM(Manifold *this,ConstRefVec *x,ConstRefVec *v,double *prec)

{
  long lVar1;
  int iVar2;
  Index IVar3;
  
  if ((this->super_ValidManifold).flag_ != 0x677d7257) {
    puts(
        "It appears that you\'re trying to call a method from a manifold that does not exist              anymore. Possible cause: the manifold was statically created in a scope (e.g. a function) which was              left since then. For Stan: https://www.youtube.com/watch?v=Yy8MUnlT9Oo"
        );
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x148,
                  "bool mnf::Manifold::isInTxM(const ConstRefVec &, const ConstRefVec &, const double &) const"
                 );
  }
  if ((v->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value == this->tangentDim_) {
    lVar1 = (x->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_rows.m_value;
    IVar3 = representationDim(this);
    if (lVar1 == IVar3) {
      iVar2 = (*this->_vptr_Manifold[0x1e])(this,x,v,prec);
      return SUB41(iVar2,0);
    }
    __assert_fail("x.size() == representationDim()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0x14a,
                  "bool mnf::Manifold::isInTxM(const ConstRefVec &, const ConstRefVec &, const double &) const"
                 );
  }
  __assert_fail("v.size() == tangentDim_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0x149,
                "bool mnf::Manifold::isInTxM(const ConstRefVec &, const ConstRefVec &, const double &) const"
               );
}

Assistant:

Point Manifold::createPoint() const
{
  mnf_assert(isValid() || seeMessageAbove());
  lock();
  return Point(*this);
}